

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCDecoder.cpp
# Opt level: O2

int32_t __thiscall gnilk::IPCBinaryDecoder::ReadStr(IPCBinaryDecoder *this,string *outValue)

{
  ulong in_RAX;
  int i;
  uint uVar1;
  uint8_t ch;
  uint16_t len;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffff;
  (*(this->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader[10])();
  for (uVar1 = 0; uVar1 < uStack_28._6_2_; uVar1 = uVar1 + 1) {
    (*(this->super_IPCDecoderBase).super_IPCReader._vptr_IPCReader[9])(this,(long)&uStack_28 + 5);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outValue,uStack_28._5_1_);
  }
  return uStack_28._6_2_ + 2;
}

Assistant:

int32_t IPCBinaryDecoder::ReadStr(std::string &outValue) {
    uint16_t len = 0;
    ReadU16(len);
    for (int i = 0; i < len; i++) {
        uint8_t ch;
        ReadU8(ch);
        outValue += (char) ch;
    }
    return 2 + len;
}